

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_req.cxx
# Opt level: O0

ptr<buffer> __thiscall nuraft::snapshot_sync_req::serialize(snapshot_sync_req *this)

{
  element_type *peVar1;
  size_t p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  buffer *in_RSI;
  element_type *in_RDI;
  ptr<buffer> pVar2;
  ptr<buffer> snp_buf;
  ptr<buffer> *buf;
  size_t in_stack_000000c8;
  element_type *val;
  snapshot *in_stack_ffffffffffffffc8;
  buffer *in_stack_ffffffffffffffd0;
  
  val = in_RDI;
  std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ed2e0);
  snapshot::serialize(in_stack_ffffffffffffffc8);
  peVar1 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ed301);
  buffer::size(peVar1);
  peVar1 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ed32c);
  p = buffer::size(peVar1);
  peVar1 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ed349);
  buffer::pos(peVar1);
  buffer::alloc(in_stack_000000c8);
  peVar1 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ed383);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)peVar1
            );
  buffer::put(in_stack_ffffffffffffffd0,(buffer *)in_stack_ffffffffffffffc8);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ed3ab);
  buffer::put(in_RSI,(ulong)val);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ed3c8);
  buffer::put(in_RSI,(byte)((ulong)val >> 0x38));
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ed3e8);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)peVar1
            );
  buffer::put(in_stack_ffffffffffffffd0,(buffer *)in_stack_ffffffffffffffc8);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ed412);
  buffer::pos(in_RDI,p);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1ed46c);
  pVar2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = val;
  return (ptr<buffer>)pVar2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> snapshot_sync_req::serialize() {
    ptr<buffer> snp_buf = snapshot_->serialize();
    ptr<buffer> buf = buffer::alloc(snp_buf->size() + sz_ulong + sz_byte + (data_->size() - data_->pos()));
    buf->put(*snp_buf);
    buf->put(offset_);
    buf->put(done_ ? (byte)1 : (byte)0);
    buf->put(*data_);
    buf->pos(0);
    return buf;
}